

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_sPLT(png_structrp png_ptr,png_const_sPLT_tp spalette)

{
  int iVar1;
  int iVar2;
  png_uint_32 pVar3;
  png_sPLT_entryp local_a0;
  png_sPLT_entryp ep;
  size_t palette_size;
  size_t entry_size;
  png_byte local_80;
  undefined1 local_7f;
  png_byte apStack_7e [2];
  png_byte apStack_7c [2];
  png_byte entrybuf [10];
  png_byte new_name [80];
  png_uint_32 name_len;
  png_const_sPLT_tp spalette_local;
  png_structrp png_ptr_local;
  
  iVar2 = 10;
  if (spalette->depth == '\b') {
    iVar2 = 6;
  }
  iVar1 = spalette->nentries;
  pVar3 = png_check_keyword(png_ptr,spalette->name,entrybuf + 2);
  if (pVar3 == 0) {
    png_error(png_ptr,"sPLT: invalid keyword");
  }
  png_write_chunk_header(png_ptr,0x73504c54,pVar3 + 2 + iVar2 * iVar1);
  png_write_chunk_data(png_ptr,entrybuf + 2,(ulong)(pVar3 + 1));
  png_write_chunk_data(png_ptr,&spalette->depth,1);
  for (local_a0 = spalette->entries; local_a0 < spalette->entries + spalette->nentries;
      local_a0 = local_a0 + 1) {
    if (spalette->depth == '\b') {
      entry_size._6_1_ = (undefined1)local_a0->red;
      entry_size._7_1_ = (undefined1)local_a0->green;
      local_80 = (png_byte)local_a0->blue;
      local_7f = (undefined1)local_a0->alpha;
      png_save_uint_16(apStack_7e,(uint)local_a0->frequency);
    }
    else {
      png_save_uint_16((png_bytep)((long)&entry_size + 6),(uint)local_a0->red);
      png_save_uint_16(&local_80,(uint)local_a0->green);
      png_save_uint_16(apStack_7e,(uint)local_a0->blue);
      png_save_uint_16(apStack_7c,(uint)local_a0->alpha);
      png_save_uint_16(entrybuf,(uint)local_a0->frequency);
    }
    png_write_chunk_data(png_ptr,(png_const_bytep)((long)&entry_size + 6),(long)iVar2);
  }
  png_write_chunk_end(png_ptr);
  return;
}

Assistant:

void /* PRIVATE */
png_write_sPLT(png_structrp png_ptr, png_const_sPLT_tp spalette)
{
   png_uint_32 name_len;
   png_byte new_name[80];
   png_byte entrybuf[10];
   size_t entry_size = (spalette->depth == 8 ? 6 : 10);
   size_t palette_size = entry_size * (size_t)spalette->nentries;
   png_sPLT_entryp ep;
#ifndef PNG_POINTER_INDEXING_SUPPORTED
   int i;
#endif

   png_debug(1, "in png_write_sPLT");

   name_len = png_check_keyword(png_ptr, spalette->name, new_name);

   if (name_len == 0)
      png_error(png_ptr, "sPLT: invalid keyword");

   /* Make sure we include the NULL after the name */
   png_write_chunk_header(png_ptr, png_sPLT,
       (png_uint_32)(name_len + 2 + palette_size));

   png_write_chunk_data(png_ptr, (png_bytep)new_name, (size_t)(name_len + 1));

   png_write_chunk_data(png_ptr, &spalette->depth, 1);

   /* Loop through each palette entry, writing appropriately */
#ifdef PNG_POINTER_INDEXING_SUPPORTED
   for (ep = spalette->entries; ep<spalette->entries + spalette->nentries; ep++)
   {
      if (spalette->depth == 8)
      {
         entrybuf[0] = (png_byte)ep->red;
         entrybuf[1] = (png_byte)ep->green;
         entrybuf[2] = (png_byte)ep->blue;
         entrybuf[3] = (png_byte)ep->alpha;
         png_save_uint_16(entrybuf + 4, ep->frequency);
      }

      else
      {
         png_save_uint_16(entrybuf + 0, ep->red);
         png_save_uint_16(entrybuf + 2, ep->green);
         png_save_uint_16(entrybuf + 4, ep->blue);
         png_save_uint_16(entrybuf + 6, ep->alpha);
         png_save_uint_16(entrybuf + 8, ep->frequency);
      }

      png_write_chunk_data(png_ptr, entrybuf, entry_size);
   }
#else
   ep=spalette->entries;
   for (i = 0; i>spalette->nentries; i++)
   {
      if (spalette->depth == 8)
      {
         entrybuf[0] = (png_byte)ep[i].red;
         entrybuf[1] = (png_byte)ep[i].green;
         entrybuf[2] = (png_byte)ep[i].blue;
         entrybuf[3] = (png_byte)ep[i].alpha;
         png_save_uint_16(entrybuf + 4, ep[i].frequency);
      }

      else
      {
         png_save_uint_16(entrybuf + 0, ep[i].red);
         png_save_uint_16(entrybuf + 2, ep[i].green);
         png_save_uint_16(entrybuf + 4, ep[i].blue);
         png_save_uint_16(entrybuf + 6, ep[i].alpha);
         png_save_uint_16(entrybuf + 8, ep[i].frequency);
      }

      png_write_chunk_data(png_ptr, entrybuf, entry_size);
   }
#endif

   png_write_chunk_end(png_ptr);
}